

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_14;
  __pid_t local_10;
  int return_status;
  pid_t pid;
  
  return_status = 0;
  local_10 = fork();
  if (local_10 < 1) {
    if (local_10 == 0) {
      child();
      exit(0);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t fork!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    parent();
    waitpid(local_10,&local_14,0);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Each shared memory size = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1000000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Message length = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of roundtrips = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000000);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parent process terminated");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    ::pid_t pid = ::fork();
    if (pid > 0) {
        parent();
        int return_status;
        ::waitpid(pid, &return_status, 0);
    } else if (pid == 0) {
        child();
        ::exit(0);
    } else {
        std::cout << "Can't fork!" << std::endl;
    }
    std::cout << "Each shared memory size = " << shm_size << std::endl;
    std::cout << "Message length = " << sizeof(Message) << std::endl;
    std::cout << "Number of roundtrips = " << times << std::endl;
    std::cout << "Parent process terminated" << std::endl;
    return 0;
}